

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::GetConfigAttribSimpleCase::checkSurfaceTypeMask
          (GetConfigAttribSimpleCase *this,EGLint value)

{
  ostringstream *this_00;
  undefined1 local_190 [120];
  ios_base local_118 [264];
  
  if ((value & 7U) == 0) {
    local_190._0_8_ =
         ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
         ->m_log;
    this_00 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,
               "Fail, config does not actually support creation of any surface type?",0x44);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_118);
    tcu::TestContext::setTestResult
              ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Invalid value");
  }
  return;
}

Assistant:

void checkSurfaceTypeMask (EGLint value)
	{
		const EGLint	wantedBits	= EGL_WINDOW_BIT | EGL_PIXMAP_BIT | EGL_PBUFFER_BIT;

		if ((value & wantedBits) == 0)
		{
			TestLog&	log	= m_testCtx.getLog();

			log << TestLog::Message << "Fail, config does not actually support creation of any surface type?" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid value");
		}
	}